

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scc.cpp
# Opt level: O1

void __thiscall
pg::Oink::getBottomSCC(Oink *this,vector<int,_std::allocator<int>_> *scc,bool nonempty)

{
  pointer piVar1;
  ulong uVar2;
  ulong uVar3;
  
  piVar1 = (scc->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  if ((scc->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data._M_finish
      != piVar1) {
    (scc->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data._M_finish =
         piVar1;
  }
  uVar2 = this->game->n_vertices;
  if (0 < (long)uVar2) {
    uVar3 = 0;
    do {
      if (((this->disabled)._bits[uVar3 >> 6] >> (uVar3 & 0x3f) & 1) == 0) {
        tarjan(this,(int)uVar3,scc,nonempty);
        return;
      }
      uVar3 = uVar3 + 1;
    } while (uVar2 != uVar3);
  }
  return;
}

Assistant:

void
Oink::getBottomSCC(std::vector<int> &scc, bool nonempty)
{
    scc.clear();
    for (int i=0; i<game->nodecount(); i++) {
        if (!disabled[i]) {
            tarjan(i, scc, nonempty);
            return;
        }
    }
}